

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_WahWah.cpp
# Opt level: O2

int WahWah::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  EffectData *pEVar1;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<WahWah::EffectData>(state);
  if (index < 8) {
    *(float *)((long)&pEVar1->field_0 + (long)index * 4) = value;
  }
  return (uint)(index >= 8);
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        return UNITY_AUDIODSP_OK;
    }